

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O3

void plutovg_matrix_shear(plutovg_matrix_t *matrix,float shx,float shy)

{
  float fVar1;
  plutovg_matrix_t local_20;
  
  fVar1 = tanf(shy);
  local_20.c = tanf(shx);
  local_20.a = 1.0;
  local_20.d = 1.0;
  local_20.e = 0.0;
  local_20.f = 0.0;
  local_20.b = fVar1;
  plutovg_matrix_multiply(matrix,&local_20,matrix);
  return;
}

Assistant:

void plutovg_matrix_shear(plutovg_matrix_t* matrix, float shx, float shy)
{
    plutovg_matrix_t m;
    plutovg_matrix_init_shear(&m, shx, shy);
    plutovg_matrix_multiply(matrix, &m, matrix);
}